

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O1

void __thiscall QHttpThreadDelegate::abortRequest(QHttpThreadDelegate *this)

{
  long in_FS_OFFSET;
  void *local_28;
  char *pcStack_20;
  QMetaTypeInterface *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(QHttpNetworkReply **)(this + 0x150) != (QHttpNetworkReply *)0x0) {
    QHttpNetworkReply::abort(*(QHttpNetworkReply **)(this + 0x150));
    if (*(long **)(this + 0x150) != (long *)0x0) {
      (**(code **)(**(long **)(this + 0x150) + 0x20))();
    }
    *(undefined8 *)(this + 0x150) = 0;
  }
  if (this[0x88] == (QHttpThreadDelegate)0x1) {
    *(undefined4 *)(this + 0xf0) = 4;
    local_28 = (void *)0x0;
    pcStack_20 = (char *)0x0;
    local_18 = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              (*(QObject **)(this + 0x158),"quit",QueuedConnection,1,&local_28,&pcStack_20,&local_18
              );
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    QObject::deleteLater();
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::abortRequest()
{
#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::abortRequest() thread=" << QThread::currentThreadId() << "sync=" << synchronous;
#endif
    if (httpReply) {
        httpReply->abort();
        delete httpReply;
        httpReply = nullptr;
    }

    // Got aborted by the timeout timer
    if (synchronous) {
        incomingErrorCode = QNetworkReply::TimeoutError;
        QMetaObject::invokeMethod(synchronousRequestLoop, "quit", Qt::QueuedConnection);
    } else {
        //only delete this for asynchronous mode or QNetworkAccessHttpBackend will crash - see QNetworkAccessHttpBackend::postRequest()
        this->deleteLater();
    }
}